

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPPacketBuilder::PrivateBuildPacket
          (RTPPacketBuilder *this,void *data,size_t len,uint8_t pt,bool mark,uint32_t timestampinc,
          bool gotextension,uint16_t hdrextID,void *hdrextdata,size_t numhdrextwords)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  int iVar4;
  double dVar5;
  timespec local_c8;
  timespec local_b8;
  RTPPacket p;
  
  RTPPacket::RTPPacket
            (&p,pt,data,len,this->seqnr,this->timestamp,this->ssrc,mark,(uint8_t)this->numcsrcs,
             this->csrcs,gotextension,hdrextID,(uint16_t)numhdrextwords,hdrextdata,this->buffer,
             this->maxpacksize,(this->super_RTPMemoryObject).mgr);
  iVar4 = p.error;
  if (-1 < p.error) {
    this->packetlength = p.packetlength;
    if ((this->numpackets == 0) || (uVar3 = this->timestamp, uVar3 != this->prevrtptimestamp)) {
      if (RTPTime::CurrentTime()::s_initialized == '\0') {
        RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,&local_c8);
        clock_gettime(1,&local_b8);
        dVar5 = (double)local_c8.tv_nsec * 1e-09 + (double)local_c8.tv_sec;
        RTPTime::CurrentTime()::s_startOffet =
             dVar5 - ((double)local_b8.tv_nsec * 1e-09 + (double)local_b8.tv_sec);
      }
      else {
        clock_gettime(1,&local_c8);
        dVar5 = (double)local_c8.tv_nsec * 1e-09 + (double)local_c8.tv_sec +
                RTPTime::CurrentTime()::s_startOffet;
      }
      (this->lastwallclocktime).m_t = dVar5;
      uVar3 = this->timestamp;
      this->lastrtptimestamp = uVar3;
      this->prevrtptimestamp = uVar3;
    }
    uVar1 = this->numpayloadbytes;
    uVar2 = this->numpackets;
    this->numpayloadbytes = (int)p.payloadlength + uVar1;
    this->numpackets = uVar2 + 1;
    this->timestamp = uVar3 + timestampinc;
    this->seqnr = this->seqnr + 1;
    iVar4 = 0;
  }
  RTPPacket::~RTPPacket(&p);
  return iVar4;
}

Assistant:

int RTPPacketBuilder::PrivateBuildPacket(const void *data,size_t len,
	                  uint8_t pt,bool mark,uint32_t timestampinc,bool gotextension,
	                  uint16_t hdrextID,const void *hdrextdata,size_t numhdrextwords)
{
	RTPPacket p(pt,data,len,seqnr,timestamp,ssrc,mark,numcsrcs,csrcs,gotextension,hdrextID,
	            (uint16_t)numhdrextwords,hdrextdata,buffer,maxpacksize,GetMemoryManager());
	int status = p.GetCreationError();

	if (status < 0)
		return status;
	packetlength = p.GetPacketLength();

	if (numpackets == 0) // first packet
	{
		lastwallclocktime = RTPTime::CurrentTime();
		lastrtptimestamp = timestamp;
		prevrtptimestamp = timestamp;
	}
	else if (timestamp != prevrtptimestamp)
	{
		lastwallclocktime = RTPTime::CurrentTime();
		lastrtptimestamp = timestamp;
		prevrtptimestamp = timestamp;
	}
	
	numpayloadbytes += (uint32_t)p.GetPayloadLength();
	numpackets++;
	timestamp += timestampinc;
	seqnr++;

	return 0;
}